

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O1

void __thiscall brynet::net::DataSocket::normalFlush(DataSocket *this)

{
  element_type *peVar1;
  size_t __n;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  sock __fd;
  long *plVar5;
  void *pvVar6;
  ssize_t sVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  pointer __src;
  pending_packet *packet;
  _Elt_pointer ppVar12;
  _Map_pointer pppVar13;
  pointer __buf;
  _Elt_pointer ppVar14;
  ulong uVar15;
  iterator local_70;
  iterator local_50;
  
  plVar5 = (long *)__tls_get_addr(&PTR_00148f70);
  if (*plVar5 == 0) {
    pvVar6 = malloc(0x8000);
    *plVar5 = (long)pvVar6;
  }
  bVar4 = false;
  do {
    ppVar12 = (this->mSendList).
              super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->mSendList).
        super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar12) break;
    __buf = (pointer)*plVar5;
    if (ppVar12 ==
        (this->mSendList).
        super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      uVar11 = 0;
    }
    else {
      ppVar14 = (this->mSendList).
                super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      pppVar13 = (this->mSendList).
                 super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      uVar11 = 0;
      do {
        peVar1 = (ppVar12->data).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        __n = ppVar12->left;
        __src = (peVar1->_M_dataplus)._M_p + (peVar1->_M_string_length - __n);
        uVar15 = __n + uVar11;
        if (uVar15 < 0x8001) {
          memcpy(__buf + uVar11,__src,__n);
          uVar11 = uVar15;
        }
        else if (ppVar12 ==
                 (this->mSendList).
                 super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          uVar11 = __n;
          __buf = __src;
        }
        if (0x8000 < uVar15) break;
        ppVar12 = ppVar12 + 1;
        if (ppVar12 == ppVar14) {
          ppVar12 = pppVar13[1];
          pppVar13 = pppVar13 + 1;
          ppVar14 = ppVar12 + 9;
        }
      } while (ppVar12 !=
               (this->mSendList).
               super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur);
    }
    if (uVar11 == 0) {
LAB_00120ff8:
      bVar3 = false;
    }
    else {
      __fd = TcpSocket::getFD((this->mSocket)._M_t.
                              super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
                              .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl);
      sVar7 = ::send(__fd,__buf,(long)(int)uVar11,0);
      if ((int)(uint)sVar7 < 1) {
        piVar9 = __errno_location();
        if (*piVar9 != 0xb) {
          bVar4 = true;
          goto LAB_00120ff8;
        }
      }
      else {
        uVar8 = (ulong)((uint)sVar7 & 0x7fffffff);
        ppVar12 = (this->mSendList).
                  super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pppVar13 = (this->mSendList).
                   super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        uVar15 = uVar8;
        do {
          if (ppVar12 ==
              (this->mSendList).
              super__Deque_base<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur) break;
          uVar2 = ppVar12->left;
          if (uVar2 < uVar15 || uVar2 - uVar15 == 0) {
            if ((ppVar12->mCompleteCallback).super__Function_base._M_manager != (_Manager_type)0x0)
            {
              (*(ppVar12->mCompleteCallback)._M_invoker)((_Any_data *)&ppVar12->mCompleteCallback);
            }
            uVar10 = uVar15 - uVar2;
            local_70._M_first = *pppVar13;
            local_70._M_last = local_70._M_first + 9;
            local_70._M_cur = ppVar12;
            local_70._M_node = pppVar13;
            std::
            deque<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
            ::_M_erase(&local_50,&this->mSendList,&local_70);
            pppVar13 = local_50._M_node;
            ppVar12 = local_50._M_cur;
          }
          else {
            ppVar12->left = uVar2 - uVar15;
            uVar10 = uVar15;
          }
          bVar3 = uVar2 <= uVar15;
          uVar15 = uVar10;
        } while (bVar3);
        bVar3 = true;
        if (uVar8 == uVar11) goto LAB_00120ffa;
      }
      this->mCanWrite = false;
      checkWrite(this);
      bVar3 = false;
      bVar4 = false;
    }
LAB_00120ffa:
  } while (bVar3);
  if ((bVar4) &&
     ((this->mSocket)._M_t.
      super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t.
      super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
      super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl != (TcpSocket *)0x0)) {
    onClose(this);
  }
  return;
}

Assistant:

void DataSocket::normalFlush()
{
    static  const   int SENDBUF_SIZE = 1024 * 32;
    if (threadLocalSendBuf == nullptr)
    {
        threadLocalSendBuf = (char*)malloc(SENDBUF_SIZE);
    }

    bool must_close = false;

    while (!mSendList.empty())
    {
        char* sendptr = threadLocalSendBuf;
        size_t     wait_send_size = 0;

        for (auto it = mSendList.begin(); it != mSendList.end(); ++it)
        {
            auto& packet = *it;
            auto packetLeftBuf = (char*)(packet.data->c_str() + (packet.data->size() - packet.left));
            auto packetLeftLen = packet.left;

            if ((wait_send_size + packetLeftLen) > SENDBUF_SIZE)
            {
                if (it == mSendList.begin())
                {
                    sendptr = packetLeftBuf;
                    wait_send_size = packetLeftLen;
                }
                break;
            }

            memcpy(sendptr + wait_send_size, packetLeftBuf, packetLeftLen);
            wait_send_size += packetLeftLen;
        }

        if (wait_send_size <= 0)
        {
            break;
        }

        int send_retlen = 0;
#ifdef USE_OPENSSL
        if (mSSL != nullptr)
        {
            send_retlen = SSL_write(mSSL, sendptr, wait_send_size);
        }
        else
        {
            send_retlen = ::send(mSocket->getFD(), sendptr, wait_send_size, 0);
        }
#else
        send_retlen = ::send(mSocket->getFD(), sendptr, static_cast<int>(wait_send_size), 0);
#endif
        if (send_retlen <= 0)
        {

#ifdef USE_OPENSSL
            if ((mSSL != nullptr && SSL_get_error(mSSL, send_retlen) == SSL_ERROR_WANT_WRITE) ||
                (sErrno == S_EWOULDBLOCK))
            {
                mCanWrite = false;
                must_close = !checkWrite();
            }
            else
            {
                must_close = true;
            }
#else
            if (sErrno == S_EWOULDBLOCK)
            {
                mCanWrite = false;
                must_close = !checkWrite();
            }
            else
            {
                must_close = true;
            }
#endif
            break;
        }

        auto tmp_len = static_cast<size_t>(send_retlen);
        for (auto it = mSendList.begin(); it != mSendList.end();)
        {
            auto& packet = *it;
            if (packet.left > tmp_len)
            {
                packet.left -= tmp_len;
                break;
            }

            tmp_len -= packet.left;
            if (packet.mCompleteCallback != nullptr)
            {
                (packet.mCompleteCallback)();
            }
            it = mSendList.erase(it);
        }

        if (send_retlen != wait_send_size)
        {
            mCanWrite = false;
            must_close = !checkWrite();
            break;
        }
    }

    if (must_close)
    {
        procCloseInLoop();
    }
}